

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O1

int mctools_impl_has_winnamespace(mcu8str *path)

{
  char *pcVar1;
  uint uVar2;
  
  uVar2 = 0;
  if ((((3 < path->size) && (pcVar1 = path->c_str, pcVar1[2] == '?')) &&
      ((*pcVar1 == '\\' || (*pcVar1 == '/')))) && ((pcVar1[1] == '\\' || (pcVar1[1] == '/')))) {
    uVar2 = 1;
    if (pcVar1[3] != '/') {
      uVar2 = (uint)(pcVar1[3] == '\\');
    }
  }
  return uVar2;
}

Assistant:

int mctools_impl_has_winnamespace( const mcu8str * path )
  {
    return ( path->size >= 4 && path->c_str[2] == '?'
             && ( path->c_str[0] == '/' || path->c_str[0] == '\\' )
             && ( path->c_str[1] == '/' || path->c_str[1] == '\\' )
             && ( path->c_str[3] == '/' || path->c_str[3] == '\\' ) );
  }